

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void sha2_224_64(void *key,int len,uint32_t seed,void *out)

{
  hash_state *in_RCX;
  uint in_EDX;
  uchar *in_RDI;
  uchar buf [28];
  ulong64 local_38;
  unsigned_long in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  
  sha224_init((hash_state *)0x111672);
  ltc_state.sha256.state[0] = in_EDX ^ 0xc1059ed8;
  sha256_process(in_RCX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sha224_done((hash_state *)buf._0_8_,in_RDI);
  (in_RCX->chc).length = local_38;
  return;
}

Assistant:

inline void sha2_224_64(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[28];
  sha224_init(&ltc_state);
  ltc_state.sha256.state[0] = 0xc1059ed8UL ^ seed;
  sha224_process(&ltc_state, (unsigned char *)key, len);
  sha224_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}